

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * compute_U_value_R3(string *__return_storage_ptr__,string *user_password,
                           EncryptionData *data)

{
  int key_len;
  char *pcVar1;
  size_t sVar2;
  uchar *puVar3;
  EncryptionData *in_RCX;
  allocator *md;
  size_t n;
  size_t n_00;
  allocator local_ed;
  uint local_ec;
  undefined8 uStack_e8;
  uint i;
  char result [32];
  int local_bc;
  undefined8 local_b8;
  Digest digest;
  string local_a0;
  string local_80;
  undefined1 local_50 [8];
  MD5 md5;
  string k1;
  EncryptionData *data_local;
  string *user_password_local;
  
  QPDF::compute_encryption_key
            ((string *)
             &md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDF *)user_password,(string *)data,in_RCX);
  MD5::MD5((MD5 *)local_50,(uchar *)user_password,n,(uchar *)in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"",(allocator<char> *)(digest + 0xf));
  pad_or_truncate_password_V4(&local_80,&local_a0);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  MD5::encodeDataIncrementally((MD5 *)local_50,pcVar1,0x20);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(digest + 0xf));
  QPDF::EncryptionData::getId1_abi_cxx11_(data);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  QPDF::EncryptionData::getId1_abi_cxx11_(data);
  sVar2 = std::__cxx11::string::length();
  MD5::encodeDataIncrementally((MD5 *)local_50,pcVar1,sVar2);
  MD5::digest((MD5 *)local_50,(uchar *)&local_b8);
  local_bc = QPDF::EncryptionData::getLengthBytes(data);
  sVar2 = QIntC::to_size<int>(&local_bc);
  pad_short_parameter((string *)
                      &md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,sVar2);
  puVar3 = QUtil::unsigned_char_pointer
                     ((string *)
                      &md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  key_len = QPDF::EncryptionData::getLengthBytes(data);
  iterate_rc4((uchar *)&local_b8,0x10,puVar3,key_len,0x14,false);
  uStack_e8 = local_b8;
  result[0] = digest[0];
  result[1] = digest[1];
  result[2] = digest[2];
  result[3] = digest[3];
  result[4] = digest[4];
  result[5] = digest[5];
  result[6] = digest[6];
  result[7] = digest[7];
  for (local_ec = 0x10; local_ec < 0x20; local_ec = local_ec + 1) {
    result[(ulong)local_ec - 8] = (char)((ulong)(local_ec * local_ec) % 0xff);
  }
  md = &local_ed;
  std::allocator<char>::allocator();
  puVar3 = (uchar *)&stack0xffffffffffffff18;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)puVar3,0x20,md);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed);
  MD5::~MD5((MD5 *)local_50,puVar3,n_00,(uchar *)md);
  std::__cxx11::string::~string
            ((string *)
             &md5.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return __return_storage_ptr__;
}

Assistant:

static std::string
compute_U_value_R3(std::string const& user_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.5 from the PDF 1.7 Reference Manual

    std::string k1 = QPDF::compute_encryption_key(user_password, data);
    MD5 md5;
    md5.encodeDataIncrementally(pad_or_truncate_password_V4("").c_str(), key_bytes);
    md5.encodeDataIncrementally(data.getId1().c_str(), data.getId1().length());
    MD5::Digest digest;
    md5.digest(digest);
    pad_short_parameter(k1, QIntC::to_size(data.getLengthBytes()));
    iterate_rc4(
        digest,
        sizeof(MD5::Digest),
        QUtil::unsigned_char_pointer(k1),
        data.getLengthBytes(),
        20,
        false);
    char result[key_bytes];
    memcpy(result, digest, sizeof(MD5::Digest));
    // pad with arbitrary data -- make it consistent for the sake of
    // testing
    for (unsigned int i = sizeof(MD5::Digest); i < key_bytes; ++i) {
        result[i] = static_cast<char>((i * i) % 0xff);
    }
    return {result, key_bytes};
}